

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O3

void __thiscall
r_exec::CmdGuardBuilder::_build
          (CmdGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  ushort uVar1;
  uint16_t *puVar2;
  short sVar3;
  undefined2 uVar4;
  uint16_t uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uint16_t uVar9;
  undefined6 in_register_0000000a;
  uint uVar10;
  undefined6 in_register_00000012;
  TimingGuardBuilder *pTVar11;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  TimingGuardBuilder local_60;
  uint16_t local_48;
  uint16_t local_46;
  undefined4 local_44;
  undefined4 local_40;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  
  local_60.period._4_4_ = (uint)CONCAT62(in_register_0000008a,t0);
  local_34 = (uint)CONCAT62(in_register_00000082,q0);
  local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ =
       (uint)CONCAT62(in_register_00000012,fwd_opcode);
  iVar6 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  (**(code **)(*plVar8 + 0x20))(plVar8,2);
  uVar4 = r_code::Atom::asIndex();
  local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       CONCAT22(local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i.
                _6_2_,uVar4);
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  uVar4 = r_code::Atom::asIndex();
  local_60.period._0_4_ = CONCAT22(local_60.period._2_2_,uVar4);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  local_40 = r_code::Atom::asIndex();
  iVar6 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
  plVar8 = (long *)CONCAT44(extraout_var_00,iVar6);
  (**(code **)(*plVar8 + 0x20))(plVar8,2);
  local_46 = r_code::Atom::asIndex();
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  uVar5 = r_code::Atom::asIndex();
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  (**(code **)(*plVar8 + 0x20))(plVar8,this->cmd_arg_index);
  uVar7 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)&local_60);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar6),(Atom *)&local_60);
  local_38 = (undefined4)CONCAT62(in_register_0000000a,bwd_opcode);
  local_48 = uVar5;
  local_44 = uVar7;
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::Set((uchar)&local_60);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar6),(Atom *)&local_60);
  pTVar11 = &local_60;
  r_code::Atom::~Atom((Atom *)pTVar11);
  local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 3;
  puVar2 = (uint16_t *)((long)&local_60.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar5 = local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_2_;
  uVar9 = local_60.period._4_2_;
  uVar10 = local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ &
           0xffff;
  local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       local_60.period._4_4_ & 0xffff;
  local_60.period._4_4_ = uVar10;
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,uVar5,uVar9,Opcodes::Add,(this->super_TimingGuardBuilder).period,
             write_index,puVar2);
  uVar5 = (uint16_t)local_60.period;
  local_60.period._0_4_ = (uint)local_60.period & 0xffff;
  local_3c = (uint)t1;
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,uVar5,t1,Opcodes::Add,(this->super_TimingGuardBuilder).period,write_index,
             puVar2);
  sVar3 = local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ = uVar1;
  r_code::Atom::AssignmentPointer((uchar)&local_60,(ushort)(byte)local_40);
  uVar5 = *write_index;
  *write_index = uVar5 + 1;
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar5 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::Operator
            ((ushort)&local_60,
             (uchar)(uint)local_60.super_GuardBuilder.super__Object.refCount.
                          super___atomic_base<long>._M_i);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  uVar7 = local_44;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  uVar10 = local_34 & 0xffff;
  r_code::Atom::VLPointer((ushort)&local_60,(ushort)local_34);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::VLPointer((ushort)&local_60,(ushort)uVar7);
  local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ = sVar3 + 3;
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])
                    (mdl,(ulong)local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  *write_index = sVar3 + 5;
  r_code::Atom::IPointer((ushort)&local_60);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar6),(Atom *)&local_60);
  local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ = uVar10;
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::Set((uchar)&local_60);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar6),(Atom *)&local_60);
  pTVar11 = &local_60;
  r_code::Atom::~Atom((Atom *)pTVar11);
  local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 5;
  puVar2 = (uint16_t *)((long)&local_60.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar5 = (uint16_t)local_60.period._4_4_;
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,
             (uint16_t)
             local_60.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_
             ,uVar5,Opcodes::Sub,(this->super_TimingGuardBuilder).period,write_index,puVar2);
  uVar9 = (uint16_t)(uint)local_60.period;
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,(uint16_t)local_3c,uVar9,Opcodes::Sub,
             (this->super_TimingGuardBuilder).period,write_index,puVar2);
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,local_46,uVar5,Opcodes::Sub,(this->super_TimingGuardBuilder).period,
             write_index,puVar2);
  TimingGuardBuilder::write_guard
            (pTVar11,mdl,local_48,uVar9,Opcodes::Sub,(this->super_TimingGuardBuilder).period,
             write_index,puVar2);
  sVar3 = local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = local_60.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  r_code::Atom::AssignmentPointer((uchar)&local_60,(ushort)(byte)local_44);
  uVar5 = *write_index;
  *write_index = uVar5 + 1;
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar5 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::Operator((ushort)&local_60,(uchar)local_38);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::VLPointer((ushort)&local_60,(ushort)local_40);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  r_code::Atom::VLPointer
            ((ushort)&local_60,
             (ushort)(uint)local_60.super_GuardBuilder.super__Object.refCount.
                           super___atomic_base<long>._M_i);
  iVar6 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 3));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar6),(Atom *)&local_60);
  r_code::Atom::~Atom((Atom *)&local_60);
  *write_index = sVar3 + 4;
  return;
}

Assistant:

void CmdGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t cmd_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t cmd_t1 = lhs->code(FACT_BEFORE).asIndex();
    uint16_t cmd_arg = lhs->get_reference(0)->code(cmd_arg_index).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 cmd_arg)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::VLPointer(cmd_arg);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t1, t3, Opcodes::Sub, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(cmd_arg, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // cmd_arg:(bwd_opcode q1 q0)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    extent_index += 1;
    write_index = extent_index;
}